

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O2

size_t __thiscall axl::err::Error::createStringError(Error *this,StringRef *string)

{
  size_t size;
  undefined8 uVar1;
  ErrorHdr *pEVar2;
  size_t size_00;
  
  size = string->m_length;
  size_00 = size + 0x19;
  pEVar2 = rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
                     (&this->
                       super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>,
                      size_00,false);
  if (pEVar2 == (ErrorHdr *)0x0) {
    size_00 = 0xffffffffffffffff;
  }
  else {
    pEVar2->m_size = (uint32_t)size_00;
    uVar1 = g_stdErrorGuid._8_8_;
    *(undefined8 *)&(pEVar2->m_guid).field_0 = g_stdErrorGuid._0_8_;
    *(undefined8 *)((long)&(pEVar2->m_guid).field_0 + 8) = uVar1;
    pEVar2->m_code = 1;
    __wrap_memcpy(pEVar2 + 1,string->m_p,size);
    *(undefined1 *)((long)&pEVar2[1].m_size + size) = 0;
  }
  return size_00;
}

Assistant:

size_t
Error::createStringError(const sl::StringRef& string) {
	size_t length = string.getLength();
	size_t size = sizeof(ErrorHdr) + length + 1;

	ErrorHdr* error = createBuffer(size);
	if (!error)
		return -1;

	error->m_size = (uint32_t)size;
	error->m_guid = g_stdErrorGuid;
	error->m_code = StdErrorCode_String;

	char* dst = (char*)(error + 1);

	memcpy(dst, string.cp(), length);
	dst[length] = 0;

	return size;
}